

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O3

int __thiscall embree::TutorialApplication::main(TutorialApplication *this,int argc,char **argv)

{
  char **argv_00;
  
  CommandLineParser::parseCommandLine(&(this->super_Application).commandLineParser,argc,argv);
  (*(this->super_Application)._vptr_Application[3])(this);
  create_device(this);
  run(this,argc,argv_00);
  return 0;
}

Assistant:

int TutorialApplication::main(int argc, char** argv) try
  {
    /* parse command line options */
    parseCommandLine(argc,argv);

    /* callback */
    postParseCommandLine();

    /* create embree device */
    create_device();
  
    /* start tutorial */
    run(argc,argv);
    return 0;
  }
  catch (const std::exception& e) {
    std::cout << "Error: " << e.what() << std::endl;
    return 1;
  }
  catch (...) {
    std::cout << "Error: unknown exception caught." << std::endl;
    return 1;
  }